

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

QWidget * __thiscall QDataWidgetMapper::mappedWidgetAt(QDataWidgetMapper *this,int section)

{
  long *plVar1;
  long *plVar2;
  
  plVar2 = *(long **)(*(long *)(this + 8) + 0xa0);
  plVar1 = *(long **)(*(long *)(this + 8) + 0xa8);
  if (plVar2 != plVar1) {
    while ((int)plVar2[2] != section) {
      plVar2 = plVar2 + 7;
      if (plVar2 == plVar1) {
        return (QWidget *)0x0;
      }
    }
    if ((*plVar2 != 0) && (*(int *)(*plVar2 + 4) != 0)) {
      return (QWidget *)plVar2[1];
    }
  }
  return (QWidget *)0x0;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }